

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

iterator * __thiscall
NNTreeImpl::findInternal
          (iterator *__return_storage_ptr__,NNTreeImpl *this,QPDFObjectHandle *key,
          bool return_prev_if_not_found)

{
  NNTreeDetails *pNVar1;
  QPDF *pQVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  pointer pTVar7;
  QPDFObjGen og;
  undefined8 extraout_RAX;
  undefined7 in_register_00000009;
  offset_in_NNTreeImpl_to_subr in_R9;
  allocator<char> local_259;
  NNTreeImpl *local_258;
  undefined4 local_24c;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *local_248;
  string local_240;
  QPDFObjectHandle node;
  QPDFObjectHandle items;
  QPDFObjectHandle kids;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_160;
  iterator last_item;
  set seen;
  iterator first_item;
  
  local_24c = (undefined4)CONCAT71(in_register_00000009,return_prev_if_not_found);
  local_248 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key;
  begin(&first_item,this);
  last_item.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&last_item.path;
  last_item._vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002ac098;
  last_item.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  last_item.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node._M_size = 0;
  last_item.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  last_item.item_number = -1;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._M_parent;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl._0_8_
       = &PTR__NNTreeIterator_002ac098;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  last_item.ivalue.first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  last_item.ivalue.first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  last_item.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  last_item.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  last_item.impl = this;
  last_item.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       last_item.path.
       super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._0_8_ = this;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left =
       seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
       super__Rb_tree_header._M_header._M_parent;
  bVar3 = NNTreeIterator::operator==(&first_item,(NNTreeIterator *)&seen);
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)&seen);
  if (bVar3) {
    __return_storage_ptr__->_vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002ac098;
    __return_storage_ptr__->impl = this;
    (__return_storage_ptr__->path).
    super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&__return_storage_ptr__->path
    ;
    (__return_storage_ptr__->path).
    super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&__return_storage_ptr__->path
    ;
    (__return_storage_ptr__->node).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->path).
    super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
    _M_impl._M_node._M_size = 0;
    (__return_storage_ptr__->node).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    __return_storage_ptr__->item_number = -1;
    (__return_storage_ptr__->ivalue).first.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ivalue).first.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0012908f;
  }
  local_258 = this;
  if (first_item.item_number < 0) {
LAB_00128cac:
    if (last_item.item_number < 0) {
LAB_00128da2:
      seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
            _M_impl.super__Rb_tree_header._M_header;
      seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
      super__Rb_tree_header._M_header._0_8_ =
           seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
           _M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
           _M_impl.super__Rb_tree_header._M_header._M_left;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&node,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&this->oh);
      __return_storage_ptr__->_vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002ac098;
      __return_storage_ptr__->impl = this;
      (__return_storage_ptr__->path).
      super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
      _M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)&__return_storage_ptr__->path;
      (__return_storage_ptr__->path).
      super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
      _M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)&__return_storage_ptr__->path;
      (__return_storage_ptr__->node).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->path).
      super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
      _M_impl._M_node._M_size = 0;
      (__return_storage_ptr__->node).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      __return_storage_ptr__->item_number = -1;
      (__return_storage_ptr__->ivalue).first.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->ivalue).first.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)&node);
        bVar3 = QPDFObjGen::set::add(&seen,og);
        if (!bVar3) {
          pQVar2 = local_258->qpdf;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,"loop detected in find",(allocator<char> *)&kids);
          ::error(pQVar2,&node,&local_240);
LAB_001290f1:
          pQVar2 = local_258->qpdf;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,
                     "unexpected -1 from binary search of kids; limits may by wrong",&local_259);
          ::error(pQVar2,&node,&local_240);
LAB_00129122:
          pQVar2 = local_258->qpdf;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,"bad node during find",&local_259);
          ::error(pQVar2,&node,&local_240);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
          NNTreeIterator::~NNTreeIterator(&last_item);
          NNTreeIterator::~NNTreeIterator(&first_item);
          _Unwind_Resume(extraout_RAX);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,"/Kids",(allocator<char> *)&items);
        QPDFObjectHandle::getKey(&kids,(string *)&node);
        std::__cxx11::string::~string((string *)&local_240);
        bVar3 = QPDFObjectHandle::isArray(&kids);
        iVar5 = 0;
        if (bVar3) {
          iVar5 = QPDFObjectHandle::getArrayNItems(&kids);
        }
        (*(code *)**(undefined8 **)local_258->details)();
        QPDFObjectHandle::getKey(&items,(string *)&node);
        bVar3 = QPDFObjectHandle::isArray(&items);
        if ((bVar3) && (uVar6 = QPDFObjectHandle::getArrayNItems(&items), 0 < (int)uVar6)) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_180,local_248);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_190,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&items);
          local_240._M_dataplus._M_p = (pointer)compareKeyItem;
          local_240._M_string_length = 0;
          iVar5 = binarySearch(local_258,(QPDFObjectHandle *)&local_180,
                               (QPDFObjectHandle *)&local_190,uVar6 >> 1,(bool)(char)local_24c,in_R9
                              );
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180._M_refcount);
          if (-1 < iVar5) {
            NNTreeIterator::setItemNumber(__return_storage_ptr__,&node,iVar5 * 2);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&items.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&kids.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&node.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::
          _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
          ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                       *)&seen);
          goto LAB_0012908f;
        }
        if (iVar5 < 1) goto LAB_00129122;
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1a0,local_248);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1b0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&kids);
        local_240._M_dataplus._M_p = (pointer)compareKeyKid;
        local_240._M_string_length = 0;
        iVar5 = binarySearch(local_258,(QPDFObjectHandle *)&local_1a0,(QPDFObjectHandle *)&local_1b0
                             ,iVar5,true,in_R9);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
        if (iVar5 == -1) goto LAB_001290f1;
        NNTreeIterator::addPathElement(__return_storage_ptr__,&node,iVar5);
        QPDFObjectHandle::getArrayItem
                  ((QPDFObjectHandle *)&local_240,
                   (int)(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&kids);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&node,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_240);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_240._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&items.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&kids.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      } while( true );
    }
    pNVar1 = this->details;
    pTVar7 = NNTreeIterator::operator->(&last_item);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1e0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pTVar7);
    cVar4 = (**(code **)(*(long *)pNVar1 + 8))(pNVar1,&local_1e0);
    this = local_258;
    if (cVar4 == '\0') {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
      goto LAB_00128da2;
    }
    pNVar1 = local_258->details;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1f0,local_248);
    pTVar7 = NNTreeIterator::operator->(&last_item);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_170,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pTVar7);
    iVar5 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_1f0,&local_170);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
    this = local_258;
    if (iVar5 < 1) goto LAB_00128da2;
    if ((char)local_24c != '\0') {
      NNTreeIterator::NNTreeIterator(__return_storage_ptr__,&last_item);
      goto LAB_0012908f;
    }
  }
  else {
    pNVar1 = this->details;
    pTVar7 = NNTreeIterator::operator->(&first_item);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pTVar7);
    cVar4 = (**(code **)(*(long *)pNVar1 + 8))(pNVar1,&local_1c0);
    this = local_258;
    if (cVar4 == '\0') {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0._M_refcount);
      goto LAB_00128cac;
    }
    pNVar1 = local_258->details;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1d0,local_248);
    pTVar7 = NNTreeIterator::operator->(&first_item);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_160,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pTVar7);
    iVar5 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_1d0,&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0._M_refcount);
    this = local_258;
    if (-1 < iVar5) goto LAB_00128cac;
  }
  __return_storage_ptr__->_vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002ac098;
  __return_storage_ptr__->impl = local_258;
  (__return_storage_ptr__->path).
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&__return_storage_ptr__->path;
  (__return_storage_ptr__->path).
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&__return_storage_ptr__->path;
  (__return_storage_ptr__->node).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->path).
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node._M_size = 0;
  (__return_storage_ptr__->node).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  __return_storage_ptr__->item_number = -1;
  (__return_storage_ptr__->ivalue).first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->ivalue).first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0012908f:
  NNTreeIterator::~NNTreeIterator(&last_item);
  NNTreeIterator::~NNTreeIterator(&first_item);
  return __return_storage_ptr__;
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::findInternal(QPDFObjectHandle key, bool return_prev_if_not_found)
{
    auto first_item = begin();
    auto last_item = end();
    if (first_item == end()) {
        // Empty
        return end();
    } else if (
        first_item.valid() && details.keyValid(first_item->first) &&
        details.compareKeys(key, first_item->first) < 0) {
        // Before the first key
        return end();
    } else if (
        last_item.valid() && details.keyValid(last_item->first) &&
        details.compareKeys(key, last_item->first) > 0) {
        // After the last key
        if (return_prev_if_not_found) {
            return last_item;
        } else {
            return end();
        }
    }

    QPDFObjGen::set seen;
    auto node = this->oh;
    iterator result(*this);

    while (true) {
        if (!seen.add(node)) {
            QTC::TC("qpdf", "NNTree loop in find");
            error(qpdf, node, "loop detected in find");
        }

        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;
        if (nitems > 0) {
            int idx = binarySearch(
                key, items, nitems / 2, return_prev_if_not_found, &NNTreeImpl::compareKeyItem);
            if (idx >= 0) {
                result.setItemNumber(node, 2 * idx);
            }
            break;
        } else if (nkids > 0) {
            int idx = binarySearch(key, kids, nkids, true, &NNTreeImpl::compareKeyKid);
            if (idx == -1) {
                QTC::TC("qpdf", "NNTree -1 in binary search");
                error(
                    qpdf,
                    node,
                    "unexpected -1 from binary search of kids;"
                    " limits may by wrong");
            }
            result.addPathElement(node, idx);
            node = kids.getArrayItem(idx);
        } else {
            QTC::TC("qpdf", "NNTree bad node during find");
            error(qpdf, node, "bad node during find");
        }
    }

    return result;
}